

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xform.cpp
# Opt level: O3

double __thiscall ON_Xform::Determinant(ON_Xform *this,double *pivot)

{
  double p;
  double d;
  double I [4] [4];
  double local_98;
  double local_90;
  double local_88 [16];
  
  local_90 = 0.0;
  local_98 = 0.0;
  Inv((double *)this,(double (*) [4])local_88,&local_90,&local_98);
  if (pivot != (double *)0x0) {
    *pivot = local_98;
  }
  return (double)(~-(ulong)(local_90 != 0.0) & (ulong)local_90 |
                 (ulong)(1.0 / local_90) & -(ulong)(local_90 != 0.0));
}

Assistant:

double ON_Xform::Determinant( double* pivot ) const
{
  double I[4][4], d = 0.0, p = 0.0;
  //int rank = 
  Inv( &m_xform[0][0], I, &d, &p );
  if ( pivot )
    *pivot = p;
  if (d != 0.0 )
    d = 1.0/d;

  return d;
}